

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O3

int nni_tcp_dialer_init(nni_tcp_dialer **dp)

{
  int iVar1;
  nni_tcp_dialer *list;
  
  list = (nni_tcp_dialer *)nni_zalloc(0xe8);
  if (list == (nni_tcp_dialer *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_mtx_init(&list->mtx);
    list->closed = false;
    list->nodelay = true;
    nni_refcnt_init(&list->ref,1,list,tcp_dialer_fini);
    nni_aio_list_init((nni_list *)list);
    *dp = list;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_tcp_dialer_init(nni_tcp_dialer **dp)
{
	nni_tcp_dialer *d;

	if ((d = NNI_ALLOC_STRUCT(d)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&d->mtx);
	d->closed  = false;
	d->nodelay = true;
	nni_refcnt_init(&d->ref, 1, d, tcp_dialer_fini);
	nni_aio_list_init(&d->connq);
	*dp = d;
	return (0);
}